

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::AssertionInstanceExpression::fromLookup
          (AssertionInstanceExpression *this,Symbol *symbol,InvocationExpressionSyntax *syntax,
          SourceRange range,ASTContext *parentContext)

{
  Scope *pSVar1;
  char_pointer puVar2;
  char *pcVar3;
  group_type_pointer pgVar4;
  string_view *sv;
  ExpressionKind EVar5;
  SymbolKind SVar6;
  undefined4 uVar7;
  Compilation *this_00;
  SyntaxNode *this_01;
  size_t sVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  PropertySymbol *pPVar11;
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  _Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  AssertionInstanceDetails *pAVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  Type *args;
  opt_storage<const_slang::ast::Symbol_*> *poVar20;
  uint64_t uVar21;
  SourceLocation SVar22;
  Diagnostic *pDVar23;
  char_pointer puVar24;
  AssertionInstanceExpression *expr;
  AssertionExpr *args_2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InvalidAssertionExpr *args_2_00;
  AssertionInstanceDetails *pAVar25;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  size_t extraout_RDX;
  SyntaxNode *pSVar26;
  char_pointer puVar27;
  uint uVar28;
  ulong uVar29;
  SyntaxKind typeKind;
  DiagCode code;
  DiagCode code_00;
  ulong uVar30;
  long lVar31;
  ulong hash;
  ulong uVar32;
  opt_storage<const_slang::ast::Symbol_*> symbol_00;
  opt_storage<const_slang::ast::Symbol_*> formal;
  opt_storage<const_slang::ast::Symbol_*> *poVar33;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
  *pair;
  long lVar34;
  PropertySymbol *pPVar35;
  table_element_pointer ppVar36;
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  _Var37;
  bool bVar38;
  uchar uVar39;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  char cVar46;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  undefined1 auVar47 [16];
  LookupLocation LVar63;
  SourceRange SVar64;
  iterator iVar65;
  string_view arg_00;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *local_490;
  try_emplace_args_t local_481;
  PropertySymbol *prop;
  SyntaxNode *local_478;
  opt_storage<const_slang::ast::Symbol_*> local_470;
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  local_468;
  opt_storage<const_slang::ast::Symbol_*> *local_460;
  SourceRange range_local;
  value_type_pointer local_448;
  value_type *elements;
  SourceLocation local_430;
  ulong local_410;
  long local_408;
  SmallVector<const_slang::ast::Symbol_*,_5UL> localVars;
  value_type *elements_1;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  AssertionInstanceDetails *local_368;
  _Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false> local_360;
  undefined8 local_358;
  char cStack_350;
  char cStack_34f;
  char cStack_34e;
  char cStack_34d;
  char cStack_34c;
  char cStack_34b;
  char cStack_34a;
  char cStack_349;
  AssertionInstanceDetails instance;
  ActualArg arg;
  ASTContext context;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> orderedArgs;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
  x;
  SmallVector<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>,_4UL>
  actualArgs;
  NamedArgMap namedArgs;
  
  SVar22 = range.endLoc;
  range_local.endLoc = range.startLoc;
  this_00 = (Compilation *)**(undefined8 **)SVar22;
  range_local.startLoc = (SourceLocation)syntax;
  Compilation::noteReference(this_00,(Symbol *)this,false);
  EVar5 = (this->super_Expression).kind;
  prop = (PropertySymbol *)this;
  if (EVar5 == 0x55) {
    args = this_00->voidType;
  }
  else {
    if (EVar5 == 0x50) {
      typeKind = PropertyType;
    }
    else {
      typeKind = SequenceType;
    }
    args = Compilation::getType(this_00,typeKind);
  }
  local_460 = (opt_storage<const_slang::ast::Symbol_*> *)(prop->ports)._M_ptr;
  local_468 = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               )(prop->ports)._M_extent._M_extent_value;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ =
       (pointer)orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len = 0;
  namedArgs.super_Storage.ptr = (char *)&namedArgs;
  namedArgs._272_8_ = 0x3f;
  namedArgs._280_8_ = 1;
  namedArgs._288_16_ = ZEXT816(0x516460);
  namedArgs._304_8_ = 0;
  orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.cap = 5;
  namedArgs._312_8_ = 0;
  namedArgs.super_Storage._264_8_ = namedArgs.super_Storage.ptr;
  if (((symbol == (Symbol *)0x0) || (symbol[1].location == (SourceLocation)0x0)) ||
     (bVar17 = Expression::collectArgs
                         ((ASTContext *)SVar22,(ArgumentListSyntax *)symbol[1].location,
                          &orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>,
                          &namedArgs), bVar17)) {
    context.assertionInstance = *(AssertionInstanceDetails **)((long)SVar22 + 0x30);
    context.scope.ptr = *(Scope **)SVar22;
    context._8_8_ = *(undefined8 *)((long)SVar22 + 8);
    context.flags.m_bits = ((bitmask<slang::ast::ASTFlags> *)((long)SVar22 + 0x10))->m_bits;
    context.instanceOrProc = *(Symbol **)((long)SVar22 + 0x18);
    context.firstTempVar = *(TempVarSymbol **)((long)SVar22 + 0x20);
    context.randomizeDetails = *(RandomizeDetails **)((long)SVar22 + 0x28);
    ASTContext::tryFillAssertionDetails(&context);
    pPVar35 = prop;
    instance.argumentMap.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
    .arrays.groups_size_index = 0x3f;
    instance.argumentMap.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
    .arrays.groups_size_mask = 1;
    instance.argumentMap.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
    .arrays._16_16_ = ZEXT816(0x516460);
    instance.argumentMap.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
    .size_ctrl.ml = 0;
    instance.argumentMap.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
    .size_ctrl.size = 0;
    instance.localVars.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
    .arrays.groups_size_index = 0x3f;
    instance.localVars.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
    .arrays.groups_size_mask = 1;
    instance.localVars.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
    .arrays._16_16_ = ZEXT816(0x516460);
    instance.localVars.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
    .size_ctrl.ml = 0;
    instance._112_9_ = SUB169((undefined1  [16])0x0,0);
    instance.argExpansionLoc._1_7_ = 0;
    instance.argDetails = (AssertionInstanceDetails *)0x0;
    instance.isRecursive = false;
    instance.prevContext = &context;
    instance.symbol = &prop->super_Symbol;
    instance.instanceLoc = range_local.startLoc;
    if (context.assertionInstance != (AssertionInstanceDetails *)0x0) {
      SVar6 = (prop->super_Symbol).kind;
      pAVar25 = context.assertionInstance;
      do {
        if ((PropertySymbol *)pAVar25->symbol == prop) {
          if (SVar6 == Sequence) {
            code_00.subsystem = Expressions;
            code_00.code = 0x90;
          }
          else {
            if (SVar6 != LetDecl) {
              if (pAVar25->isRecursive != true) {
                instance.isRecursive = true;
                goto LAB_004acf61;
              }
              actualArgs.
              super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
              .data_ = (pointer)0x0;
              args_2_00 = BumpAllocator::emplace<slang::ast::InvalidAssertionExpr,decltype(nullptr)>
                                    ((BumpAllocator *)this_00,(void **)&actualArgs);
              actualArgs.
              super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
              .data_ = (pointer)CONCAT71(actualArgs.
                                         super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                                         .data_._1_7_,1);
              expr = BumpAllocator::
                     emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::InvalidAssertionExpr&,bool,slang::SourceRange&>
                               ((BumpAllocator *)this_00,args,&pPVar35->super_Symbol,args_2_00,
                                (bool *)&actualArgs,&range_local);
              goto LAB_004adedd;
            }
            code_00.subsystem = Expressions;
            code_00.code = 0x8c;
          }
          SVar64.endLoc = range_local.endLoc;
          SVar64.startLoc = range_local.startLoc;
          pDVar23 = ASTContext::addDiag(&context,code_00,SVar64);
          Diagnostic::operator<<(pDVar23,(pPVar35->super_Symbol).name);
          expr = (AssertionInstanceExpression *)Expression::badExpr(this_00,(Expression *)0x0);
          goto LAB_004adedd;
        }
LAB_004acf61:
        pAVar16 = pAVar25->argDetails;
        if (pAVar25->argDetails == (AssertionInstanceDetails *)0x0) {
          pAVar16 = pAVar25->prevContext->assertionInstance;
        }
        pAVar25 = pAVar16;
      } while (pAVar25 != (AssertionInstanceDetails *)0x0);
    }
    pSVar1 = &prop->super_Scope;
    actualArgs.
    super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    .data_ = (pointer)actualArgs.
                      super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                      .firstElement;
    actualArgs.
    super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    .len = 0;
    actualArgs.
    super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    .cap = 4;
    local_410 = 0;
    _Var37 = local_468;
    if (local_468 ==
        (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         )0x0) {
      local_430 = (SourceLocation)0x0;
      bVar17 = false;
    }
    else {
      local_410 = 0;
      poVar20 = local_460 + (long)local_468;
      bVar17 = false;
      local_430 = (SourceLocation)0x0;
      poVar33 = local_460;
      do {
        symbol_00 = (opt_storage<const_slang::ast::Symbol_*>)poVar33->t_;
        localVars.stackBase[0x18] = '\0';
        local_470 = symbol_00;
        if (local_410 < orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len) {
          this_01 = orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_
                    [local_410];
          local_490 = (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&context;
          pSVar26 = this_01;
          if (this_01->kind == EmptyArgument) {
            pSVar26 = *(SyntaxNode **)(symbol_00.t_ + 2);
            LVar63 = LookupLocation::after(symbol_00.t_);
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
                 CONCAT44(localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len._4_4_,
                          LVar63.index);
            localVars.stackBase[0] = '\0';
            localVars.stackBase[1] = '\0';
            localVars.stackBase[2] = '\0';
            localVars.stackBase[3] = '\0';
            localVars.stackBase[4] = '\0';
            localVars.stackBase[5] = '\0';
            localVars.stackBase[6] = '\0';
            localVars.stackBase[7] = '\0';
            localVars.stackBase[8] = '\0';
            localVars.stackBase[9] = '\0';
            localVars.stackBase[10] = '\0';
            localVars.stackBase[0xb] = '\0';
            localVars.stackBase[0xc] = '\0';
            localVars.stackBase[0xd] = '\0';
            localVars.stackBase[0xe] = '\0';
            localVars.stackBase[0xf] = '\0';
            localVars.stackBase[0x18] = '\x01';
            localVars.stackBase._16_8_ = &instance;
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>._16_16_ =
                 ZEXT816(0x2000000000);
            if ((pSVar26 == (SyntaxNode *)0x0) && (((symbol_00.t_)->name)._M_len != 0)) {
              localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pSVar1;
              SVar64 = slang::syntax::SyntaxNode::sourceRange(this_01);
              pDVar23 = ASTContext::addDiag(&context,(DiagCode)0x7,SVar64);
              Diagnostic::operator<<(pDVar23,(symbol_00.t_)->name);
              local_490 = &localVars;
            }
            else {
              local_490 = &localVars;
              localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pSVar1;
            }
          }
          local_410 = (ulong)((int)local_410 + 1);
          local_478 = pSVar26;
          uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &namedArgs.super_Storage.field_0x108,&(symbol_00.t_)->name);
          uVar13 = namedArgs._280_8_;
          uVar30 = uVar21 >> (namedArgs._272_1_ & 0x3f);
          uVar14 = namedArgs._288_8_;
          lVar31 = (uVar21 & 0xff) * 4;
          cVar46 = (&UNK_0051605c)[lVar31];
          cVar48 = (&UNK_0051605d)[lVar31];
          cVar49 = (&UNK_0051605e)[lVar31];
          cVar50 = (&UNK_0051605f)[lVar31];
          uVar15 = namedArgs._296_8_;
          uVar29 = 0;
          cVar51 = cVar46;
          cVar52 = cVar48;
          cVar53 = cVar49;
          cVar54 = cVar50;
          cVar55 = cVar46;
          cVar56 = cVar48;
          cVar57 = cVar49;
          cVar58 = cVar50;
          cVar59 = cVar46;
          cVar60 = cVar48;
          cVar61 = cVar49;
          cVar62 = cVar50;
          do {
            pcVar3 = (char *)(uVar14 + uVar30 * 0x10);
            auVar41[0] = -(*pcVar3 == cVar46);
            auVar41[1] = -(pcVar3[1] == cVar48);
            auVar41[2] = -(pcVar3[2] == cVar49);
            auVar41[3] = -(pcVar3[3] == cVar50);
            auVar41[4] = -(pcVar3[4] == cVar51);
            auVar41[5] = -(pcVar3[5] == cVar52);
            auVar41[6] = -(pcVar3[6] == cVar53);
            auVar41[7] = -(pcVar3[7] == cVar54);
            auVar41[8] = -(pcVar3[8] == cVar55);
            auVar41[9] = -(pcVar3[9] == cVar56);
            auVar41[10] = -(pcVar3[10] == cVar57);
            auVar41[0xb] = -(pcVar3[0xb] == cVar58);
            auVar41[0xc] = -(pcVar3[0xc] == cVar59);
            auVar41[0xd] = -(pcVar3[0xd] == cVar60);
            auVar41[0xe] = -(pcVar3[0xe] == cVar61);
            auVar41[0xf] = -(pcVar3[0xf] == cVar62);
            uVar28 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
            if (uVar28 != 0) {
              lVar31 = uVar15 + uVar30 * 0x1e0;
              sVar8 = ((symbol_00.t_)->name)._M_len;
              pcVar3 = ((symbol_00.t_)->name)._M_str;
              local_358._0_2_ = CONCAT11(cVar48,cVar46);
              local_358._0_3_ = CONCAT12(cVar49,(undefined2)local_358);
              local_358._0_4_ = CONCAT13(cVar50,(undefined3)local_358);
              local_358._0_5_ = CONCAT14(cVar51,(undefined4)local_358);
              local_358._0_6_ = CONCAT15(cVar52,(undefined5)local_358);
              local_358._0_7_ = CONCAT16(cVar53,(undefined6)local_358);
              local_358 = CONCAT17(cVar54,(undefined7)local_358);
              local_460 = poVar33;
              cStack_350 = cVar55;
              cStack_34f = cVar56;
              cStack_34e = cVar57;
              cStack_34d = cVar58;
              cStack_34c = cVar59;
              cStack_34b = cVar60;
              cStack_34a = cVar61;
              cStack_349 = cVar62;
              do {
                iVar19 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> iVar19 & 1) == 0; iVar19 = iVar19 + 1) {
                  }
                }
                bVar38 = sVar8 == *(size_t *)(lVar31 + (ulong)(uint)(iVar19 << 5));
                local_408 = lVar31 + (ulong)(uint)(iVar19 << 5);
                if (bVar38 && sVar8 != 0) {
                  iVar19 = bcmp(pcVar3,*(void **)(local_408 + 8),sVar8);
                  bVar38 = iVar19 == 0;
                  cVar46 = (char)local_358;
                  cVar48 = local_358._1_1_;
                  cVar49 = local_358._2_1_;
                  cVar50 = local_358._3_1_;
                  cVar51 = local_358._4_1_;
                  cVar52 = local_358._5_1_;
                  cVar53 = local_358._6_1_;
                  cVar54 = local_358._7_1_;
                  cVar55 = cStack_350;
                  cVar56 = cStack_34f;
                  cVar57 = cStack_34e;
                  cVar58 = cStack_34d;
                  cVar59 = cStack_34c;
                  cVar60 = cStack_34b;
                  cVar61 = cStack_34a;
                  cVar62 = cStack_349;
                }
                symbol_00 = local_470;
                poVar33 = local_460;
                pPVar35 = prop;
                _Var37 = local_468;
                if (bVar38) goto LAB_004ad6ad;
                uVar28 = uVar28 - 1 & uVar28;
              } while (uVar28 != 0);
            }
            if ((*(byte *)(uVar30 * 0x10 + uVar14 + 0xf) &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7]) == 0) break;
            lVar31 = uVar30 + uVar29;
            uVar29 = uVar29 + 1;
            uVar30 = lVar31 + 1U & uVar13;
          } while (uVar29 <= (ulong)uVar13);
          local_408 = 0;
LAB_004ad6ad:
          if (local_408 != 0) {
            SVar22 = parsing::Token::location((Token *)(*(long *)(local_408 + 0x10) + 0x28));
            pDVar23 = ASTContext::addDiag(&context,(DiagCode)0x4a0007,SVar22);
            Diagnostic::operator<<(pDVar23,(symbol_00.t_)->name);
            local_398 = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(this_01);
            SVar22 = parsing::Token::location((Token *)local_398);
            Diagnostic::addNote(pDVar23,(DiagCode)0xc0001,SVar22);
            *(undefined1 *)(local_408 + 0x18) = 1;
            bVar17 = true;
          }
LAB_004ad7f0:
          _Var12 = local_468;
          pPVar11 = prop;
          if (local_478 == (SyntaxNode *)0x0) {
            lVar31 = 0;
            bVar17 = true;
          }
          else {
            local_368 = *(AssertionInstanceDetails **)(local_490->stackBase + 0x10);
            local_398 = *(undefined1 (*) [16])
                         &local_490->super_SmallVectorBase<const_slang::ast::Symbol_*>;
            local_388._0_8_ = (local_490->super_SmallVectorBase<const_slang::ast::Symbol_*>).cap;
            local_388[8] = (local_490->super_SmallVectorBase<const_slang::ast::Symbol_*>).
                           firstElement[0];
            local_388[9] = (local_490->super_SmallVectorBase<const_slang::ast::Symbol_*>).
                           firstElement[1];
            local_388[10] =
                 (local_490->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[2];
            local_388[0xb] =
                 (local_490->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[3];
            local_388[0xc] =
                 (local_490->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[4];
            local_388[0xd] =
                 (local_490->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[5];
            local_388[0xe] =
                 (local_490->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[6];
            local_388[0xf] =
                 (local_490->super_SmallVectorBase<const_slang::ast::Symbol_*>).firstElement[7];
            local_378 = *(undefined1 (*) [16])local_490->stackBase;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = symbol_00;
            hash = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar30 = hash >> ((byte)instance.argumentMap.table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                    .arrays.groups_size_index & 0x3f);
            local_360._M_head_impl = (PropertyExprSyntax *)local_478;
            uVar7 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[hash & 0xff];
            local_358 = instance.argumentMap.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                        .arrays.groups_size_mask;
            uVar32 = 0;
            uVar29 = uVar30;
            formal = symbol_00;
            do {
              pgVar4 = instance.argumentMap.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                       .arrays.groups_ + uVar29;
              uVar39 = (uchar)uVar7;
              auVar47[0] = -(pgVar4->m[0].n == uVar39);
              uVar43 = (uchar)((uint)uVar7 >> 8);
              auVar47[1] = -(pgVar4->m[1].n == uVar43);
              uVar44 = (uchar)((uint)uVar7 >> 0x10);
              auVar47[2] = -(pgVar4->m[2].n == uVar44);
              uVar45 = (uchar)((uint)uVar7 >> 0x18);
              auVar47[3] = -(pgVar4->m[3].n == uVar45);
              auVar47[4] = -(pgVar4->m[4].n == uVar39);
              auVar47[5] = -(pgVar4->m[5].n == uVar43);
              auVar47[6] = -(pgVar4->m[6].n == uVar44);
              auVar47[7] = -(pgVar4->m[7].n == uVar45);
              auVar47[8] = -(pgVar4->m[8].n == uVar39);
              auVar47[9] = -(pgVar4->m[9].n == uVar43);
              auVar47[10] = -(pgVar4->m[10].n == uVar44);
              auVar47[0xb] = -(pgVar4->m[0xb].n == uVar45);
              auVar47[0xc] = -(pgVar4->m[0xc].n == uVar39);
              auVar47[0xd] = -(pgVar4->m[0xd].n == uVar43);
              auVar47[0xe] = -(pgVar4->m[0xe].n == uVar44);
              auVar47[0xf] = -(pgVar4->m[0xf].n == uVar45);
              uVar28 = (uint)(ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe);
              while (uVar28 != 0) {
                uVar9 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                  }
                }
                if ((AssertionPortSymbol *)formal.t_ ==
                    (AssertionPortSymbol *)
                    instance.argumentMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    .arrays.elements_[uVar29 * 0xf + (ulong)uVar9].first) {
                  local_448 = instance.argumentMap.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                              .arrays.elements_ + uVar29 * 0xf + (ulong)uVar9;
                }
                else {
                  uVar28 = uVar28 - 1 & uVar28;
                }
                formal = local_470;
                if ((AssertionPortSymbol *)local_470.t_ ==
                    (AssertionPortSymbol *)
                    instance.argumentMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    .arrays.elements_[uVar29 * 0xf + (ulong)uVar9].first) goto LAB_004ad978;
              }
              if ((instance.argumentMap.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   .arrays.groups_[uVar29].m[0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) {
                local_448 = (value_type_pointer)0x0;
                goto LAB_004ad978;
              }
              lVar31 = uVar29 + uVar32;
              uVar32 = uVar32 + 1;
              uVar29 = lVar31 + 1U &
                       instance.argumentMap.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                       .arrays.groups_size_mask;
            } while (uVar32 <= instance.argumentMap.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                               .arrays.groups_size_mask);
            local_448 = (value_type_pointer)0x0;
LAB_004ad978:
            x.val.storage = symbol_00;
            if (local_448 == (value_type_pointer)0x0) {
              if (instance.argumentMap.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                  .size_ctrl.size <
                  instance.argumentMap.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                  .size_ctrl.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                          ((locator *)&arg,
                           (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                            *)&instance.argumentMap,(arrays_type *)&instance.argumentMap,uVar30,hash
                           ,&local_481,(Symbol **)&x,
                           (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                            *)local_398);
                instance.argumentMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .size_ctrl.size =
                     instance.argumentMap.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                     .size_ctrl.size + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                          ((locator *)&arg,
                           (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                            *)&instance.argumentMap,hash,&local_481,(Symbol **)&x,
                           (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                            *)local_398);
              }
            }
            arg.
            super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            ._M_u = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     )0x0;
            arg.
            super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            ._M_index = '\0';
            bVar18 = checkAssertionArg((PropertyExprSyntax *)local_478,
                                       (AssertionPortSymbol *)formal.t_,(ASTContext *)local_490,&arg
                                       ,instance.isRecursive);
            bVar38 = true;
            if (bVar18) {
              local_398._9_7_ =
                   arg.
                   super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   ._9_7_;
              local_398[8] = arg.
                             super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             ._M_index;
              local_398._0_8_ =
                   arg.
                   super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   ._M_u;
              local_388._0_8_ = formal.t_;
              SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
              ::
              emplace_back<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
                        ((SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
                          *)&actualArgs,
                         (tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                          *)local_398);
              bVar38 = bVar17;
            }
            bVar17 = bVar38;
            if (((((ulong)local_430 & 0xfffffff) == 0) &&
                ((((_Optional_base<slang::ast::ArgumentDirection,_true,_true> *)
                  &formal.t_[2].name._M_len)->_M_payload).
                 super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == true)) &&
               ((((_Optional_base<slang::ast::ArgumentDirection,_true,_true> *)
                 &formal.t_[2].name._M_len)->_M_payload).
                super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload._M_value -
                Out < 2)) {
              local_430 = (formal.t_)->location;
            }
            lVar31 = 0;
            pPVar35 = pPVar11;
            _Var37 = _Var12;
          }
        }
        else {
          sv = &(symbol_00.t_)->name;
          uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &namedArgs.super_Storage.field_0x108,sv);
          uVar13 = namedArgs._280_8_;
          uVar29 = uVar21 >> (namedArgs._272_1_ & 0x3f);
          uVar14 = namedArgs._288_8_;
          lVar31 = (uVar21 & 0xff) * 4;
          cVar46 = (&UNK_0051605c)[lVar31];
          cVar48 = (&UNK_0051605d)[lVar31];
          cVar49 = (&UNK_0051605e)[lVar31];
          cVar50 = (&UNK_0051605f)[lVar31];
          uVar15 = namedArgs._296_8_;
          uVar30 = 0;
          cVar51 = cVar46;
          cVar52 = cVar48;
          cVar53 = cVar49;
          cVar54 = cVar50;
          cVar55 = cVar46;
          cVar56 = cVar48;
          cVar57 = cVar49;
          cVar58 = cVar50;
          cVar59 = cVar46;
          cVar60 = cVar48;
          cVar61 = cVar49;
          cVar62 = cVar50;
          do {
            pcVar3 = (char *)(uVar14 + uVar29 * 0x10);
            auVar40[0] = -(*pcVar3 == cVar46);
            auVar40[1] = -(pcVar3[1] == cVar48);
            auVar40[2] = -(pcVar3[2] == cVar49);
            auVar40[3] = -(pcVar3[3] == cVar50);
            auVar40[4] = -(pcVar3[4] == cVar51);
            auVar40[5] = -(pcVar3[5] == cVar52);
            auVar40[6] = -(pcVar3[6] == cVar53);
            auVar40[7] = -(pcVar3[7] == cVar54);
            auVar40[8] = -(pcVar3[8] == cVar55);
            auVar40[9] = -(pcVar3[9] == cVar56);
            auVar40[10] = -(pcVar3[10] == cVar57);
            auVar40[0xb] = -(pcVar3[0xb] == cVar58);
            auVar40[0xc] = -(pcVar3[0xc] == cVar59);
            auVar40[0xd] = -(pcVar3[0xd] == cVar60);
            auVar40[0xe] = -(pcVar3[0xe] == cVar61);
            auVar40[0xf] = -(pcVar3[0xf] == cVar62);
            uVar28 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
            if (uVar28 != 0) {
              lVar31 = uVar15 + uVar29 * 0x1e0;
              sVar8 = ((symbol_00.t_)->name)._M_len;
              local_478 = (SyntaxNode *)((symbol_00.t_)->name)._M_str;
              local_358._0_2_ = CONCAT11(cVar48,cVar46);
              local_358._0_3_ = CONCAT12(cVar49,(undefined2)local_358);
              local_358._0_4_ = CONCAT13(cVar50,(undefined3)local_358);
              local_358._0_5_ = CONCAT14(cVar51,(undefined4)local_358);
              local_358._0_6_ = CONCAT15(cVar52,(undefined5)local_358);
              local_358._0_7_ = CONCAT16(cVar53,(undefined6)local_358);
              local_358 = CONCAT17(cVar54,(undefined7)local_358);
              local_460 = poVar33;
              cStack_350 = cVar55;
              cStack_34f = cVar56;
              cStack_34e = cVar57;
              cStack_34d = cVar58;
              cStack_34c = cVar59;
              cStack_34b = cVar60;
              cStack_34a = cVar61;
              cStack_349 = cVar62;
              do {
                iVar19 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> iVar19 & 1) == 0; iVar19 = iVar19 + 1) {
                  }
                }
                bVar38 = sVar8 == *(size_t *)(lVar31 + (ulong)(uint)(iVar19 << 5));
                lVar34 = lVar31 + (ulong)(uint)(iVar19 << 5);
                if (bVar38 && sVar8 != 0) {
                  iVar19 = bcmp(local_478,*(void **)(lVar34 + 8),sVar8);
                  bVar38 = iVar19 == 0;
                  cVar46 = (char)local_358;
                  cVar48 = local_358._1_1_;
                  cVar49 = local_358._2_1_;
                  cVar50 = local_358._3_1_;
                  cVar51 = local_358._4_1_;
                  cVar52 = local_358._5_1_;
                  cVar53 = local_358._6_1_;
                  cVar54 = local_358._7_1_;
                  cVar55 = cStack_350;
                  cVar56 = cStack_34f;
                  cVar57 = cStack_34e;
                  cVar58 = cStack_34d;
                  cVar59 = cStack_34c;
                  cVar60 = cStack_34b;
                  cVar61 = cStack_34a;
                  cVar62 = cStack_349;
                }
                poVar33 = local_460;
                _Var37 = local_468;
                if (bVar38) goto LAB_004ad293;
                uVar28 = uVar28 - 1 & uVar28;
                symbol_00 = local_470;
              } while (uVar28 != 0);
            }
            if ((*(byte *)(uVar29 * 0x10 + uVar14 + 0xf) &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7]) == 0) break;
            lVar31 = uVar29 + uVar30;
            uVar30 = uVar30 + 1;
            uVar29 = lVar31 + 1U & uVar13;
          } while (uVar30 <= (ulong)uVar13);
          lVar34 = 0;
LAB_004ad293:
          pPVar35 = prop;
          if (lVar34 == 0) {
            local_478 = *(SyntaxNode **)(local_470.t_ + 2);
            LVar63 = LookupLocation::after(local_470.t_);
            pPVar35 = prop;
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
                 CONCAT44(localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len._4_4_,
                          LVar63.index);
            localVars.stackBase[0] = '\0';
            localVars.stackBase[1] = '\0';
            localVars.stackBase[2] = '\0';
            localVars.stackBase[3] = '\0';
            localVars.stackBase[4] = '\0';
            localVars.stackBase[5] = '\0';
            localVars.stackBase[6] = '\0';
            localVars.stackBase[7] = '\0';
            localVars.stackBase[8] = '\0';
            localVars.stackBase[9] = '\0';
            localVars.stackBase[10] = '\0';
            localVars.stackBase[0xb] = '\0';
            localVars.stackBase[0xc] = '\0';
            localVars.stackBase[0xd] = '\0';
            localVars.stackBase[0xe] = '\0';
            localVars.stackBase[0xf] = '\0';
            localVars.stackBase[0x18] = '\x01';
            localVars.stackBase._16_8_ = &instance;
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>._16_16_ =
                 ZEXT816(0x2000000000);
            bVar38 = true;
            lVar31 = 0;
            localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pSVar1;
            if (local_478 == (SyntaxNode *)0x0) {
              if (namedArgs._312_8_ == 0) {
                sourceRange_00.endLoc = range_local.endLoc;
                sourceRange_00.startLoc = range_local.startLoc;
                pDVar23 = ASTContext::addDiag(&context,(DiagCode)0x9f0007,sourceRange_00);
                Diagnostic::operator<<(pDVar23,(pPVar35->super_Symbol).name);
                local_398._0_8_ = _Var37;
                std::
                vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                ::emplace_back<unsigned_long>(&pDVar23->args,(unsigned_long *)local_398);
                local_398._0_8_ =
                     orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len;
                std::
                vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                ::emplace_back<unsigned_long>(&pDVar23->args,(unsigned_long *)local_398);
                lVar31 = 7;
                bVar17 = true;
                bVar38 = false;
              }
              else {
                lVar31 = 0;
                if (sv->_M_len != 0) {
                  sourceRange.endLoc = range_local.endLoc;
                  sourceRange.startLoc = range_local.startLoc;
                  pDVar23 = ASTContext::addDiag(&context,(DiagCode)0xa20007,sourceRange);
                  Diagnostic::operator<<(pDVar23,(local_470.t_)->name);
                  local_490 = &localVars;
                  lVar31 = 0;
                  goto LAB_004ad7df;
                }
              }
            }
LAB_004ad7d2:
            local_490 = &localVars;
          }
          else {
            *(undefined1 *)(lVar34 + 0x18) = 1;
            local_478 = *(SyntaxNode **)(*(long *)(lVar34 + 0x10) + 0x48);
            lVar31 = 0;
            bVar38 = true;
            if (local_478 == (SyntaxNode *)0x0) {
              local_478 = *(SyntaxNode **)(local_470.t_ + 2);
              LVar63 = LookupLocation::after(local_470.t_);
              localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
                   CONCAT44(localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len._4_4_,
                            LVar63.index);
              localVars.stackBase[0] = '\0';
              localVars.stackBase[1] = '\0';
              localVars.stackBase[2] = '\0';
              localVars.stackBase[3] = '\0';
              localVars.stackBase[4] = '\0';
              localVars.stackBase[5] = '\0';
              localVars.stackBase[6] = '\0';
              localVars.stackBase[7] = '\0';
              localVars.stackBase[8] = '\0';
              localVars.stackBase[9] = '\0';
              localVars.stackBase[10] = '\0';
              localVars.stackBase[0xb] = '\0';
              localVars.stackBase[0xc] = '\0';
              localVars.stackBase[0xd] = '\0';
              localVars.stackBase[0xe] = '\0';
              localVars.stackBase[0xf] = '\0';
              localVars.stackBase[0x18] = '\x01';
              localVars.stackBase._16_8_ = &instance;
              localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>._16_16_ =
                   ZEXT816(0x2000000000);
              localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pSVar1;
              if ((local_478 != (SyntaxNode *)0x0) || (sv->_M_len == 0)) goto LAB_004ad7d2;
              SVar64 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(lVar34 + 0x10));
              pDVar23 = ASTContext::addDiag(&context,(DiagCode)0x7,SVar64);
              Diagnostic::operator<<(pDVar23,(local_470.t_)->name);
              local_490 = &localVars;
            }
            else {
              local_490 = (SmallVector<const_slang::ast::Symbol_*,_5UL> *)&context;
            }
          }
LAB_004ad7df:
          symbol_00 = local_470;
          if (bVar38) goto LAB_004ad7f0;
        }
      } while ((lVar31 == 0) && (poVar33 = poVar33 + 1, poVar33 != poVar20));
    }
    if (local_410 < orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len) {
      sourceRange_01.endLoc = range_local.endLoc;
      sourceRange_01.startLoc = range_local.startLoc;
      pDVar23 = ASTContext::addDiag(&context,(DiagCode)0xa00007,sourceRange_01);
      Diagnostic::operator<<(pDVar23,(pPVar35->super_Symbol).name);
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)_Var37;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar23->args,(unsigned_long *)&localVars);
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ =
           (pointer)orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar23->args,(unsigned_long *)&localVars);
      bVar17 = true;
    }
    iVar65 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
             ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                      *)&namedArgs.super_Storage.field_0x108);
    if (iVar65.p_ != (table_element_pointer)0x0) {
LAB_004adb74:
      ppVar36 = iVar65.p_;
      if ((ppVar36->second).second == false) {
        SVar22 = parsing::Token::location(&((ppVar36->second).first)->name);
        pDVar23 = ASTContext::addDiag(&context,(DiagCode)0x10007,SVar22);
        arg_00 = parsing::Token::valueText(&((ppVar36->second).first)->name);
        Diagnostic::operator<<(pDVar23,arg_00);
        bVar17 = true;
        Diagnostic::operator<<(pDVar23,(prop->super_Symbol).name);
      }
      puVar24 = iVar65.pc_ + 2;
      do {
        puVar27 = puVar24;
        puVar24 = iVar65.pc_;
        ppVar36 = iVar65.p_ + 1;
        if (((uint)iVar65.pc_ & 0xf) == 0xe) goto LAB_004adc07;
        puVar2 = puVar27 + -1;
        iVar65.p_ = ppVar36;
        iVar65.pc_ = puVar24 + 1;
        puVar24 = puVar27 + 1;
      } while (*puVar2 == '\0');
      puVar27 = puVar27 + -1;
      if (*puVar2 == '\x01') {
        ppVar36 = (table_element_pointer)0x0;
      }
      goto LAB_004adbf7;
    }
LAB_004adc57:
    pPVar35 = prop;
    local_398._8_4_ = 0xffffffff;
    local_398._0_8_ = pSVar1;
    local_388 = (undefined1  [16])0x0;
    local_378 = (undefined1  [16])0x0;
    local_368 = &instance;
    if (((uint)context.flags.m_bits >> 0x16 & 1) != 0) {
      local_388 = ZEXT816(0x400000);
    }
    if (((uint)context.flags.m_bits >> 0x15 & 1) != 0) {
      local_388._0_3_ = local_388._0_3_ | 0x200000;
    }
    if ((prop->super_Symbol).kind == LetDecl) {
      expr = (AssertionInstanceExpression *)
             Expression::create(this_00,*(ExpressionSyntax **)&prop[1].super_Symbol,
                                (ASTContext *)local_398,(bitmask<slang::ast::ASTFlags>)0x0,
                                (Type *)0x0);
    }
    else {
      pcVar3 = localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 5;
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pcVar3;
      args_2 = bindAssertionBody(&prop->super_Symbol,(prop->super_Symbol).originatingSyntax,
                                 (ASTContext *)local_398,local_430,&instance,
                                 &localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>);
      arg.
      super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      .
      super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      .
      super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      .
      super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      .
      super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      .
      super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
      ._M_u = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               )((ulong)arg.
                        super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        ._M_u & 0xffffffffffffff00);
      expr = BumpAllocator::
             emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                       ((BumpAllocator *)this_00,args,&pPVar35->super_Symbol,args_2,(bool *)&arg,
                        &range_local);
      iVar19 = SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
               ::copy(&actualArgs.
                       super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                      ,(EVP_PKEY_CTX *)this_00,src);
      (expr->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar19);
      (expr->arguments)._M_extent._M_extent_value = (size_t)src_00;
      iVar19 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                         (&localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>,
                          (EVP_PKEY_CTX *)this_00,src_00);
      (expr->localVars)._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar19);
      (expr->localVars)._M_extent._M_extent_value = extraout_RDX;
      if (instance.isRecursive == true) {
        code.subsystem = Expressions;
        code.code = 0x8f;
        if ((((uint)context.flags.m_bits >> 0x16 & 1) == 0) ||
           (code.subsystem = Expressions, code.code = 0x8e,
           ((uint)context.flags.m_bits >> 0x15 & 1) != 0)) {
          sourceRange_02.endLoc = range_local.endLoc;
          sourceRange_02.startLoc = range_local.startLoc;
          ASTContext::addDiag(&context,code,sourceRange_02);
        }
      }
      if ((bVar17) || (args_2->kind == Invalid)) {
        expr = (AssertionInstanceExpression *)Expression::badExpr(this_00,&expr->super_Expression);
      }
      if (localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ != (pointer)pcVar3) {
        operator_delete(localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_);
      }
    }
    if (actualArgs.
        super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
        .data_ != (pointer)actualArgs.
                           super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                           .firstElement) {
      operator_delete(actualArgs.
                      super_SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
                      .data_);
    }
LAB_004adedd:
    if (instance.localVars.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
        .arrays.elements_ != (value_type_pointer)0x0) {
      operator_delete(instance.localVars.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                      .arrays.elements_,
                      ((instance.localVars.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                        .arrays.groups_size_mask * 0x178 + 0x186) / 3 & 0xfffffffffffffff8) * 3);
    }
    if (instance.argumentMap.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
        .arrays.elements_ != (value_type_pointer)0x0) {
      operator_delete(instance.argumentMap.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                      .arrays.elements_,
                      ((instance.argumentMap.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                        .arrays.groups_size_mask * 0x448 + 0x456) / 9 & 0xfffffffffffffff8) * 9);
    }
  }
  else {
    expr = (AssertionInstanceExpression *)Expression::badExpr(this_00,(Expression *)0x0);
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_((allocator_type)namedArgs.super_Storage._264_8_,
            (table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)&namedArgs.field_0x110);
  if (orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ !=
      (pointer)orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement) {
    operator_delete(orderedArgs.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_);
  }
  return &expr->super_Expression;
LAB_004adc07:
  do {
    auVar42[0] = -(*puVar27 == '\0');
    auVar42[1] = -(puVar27[1] == '\0');
    auVar42[2] = -(puVar27[2] == '\0');
    auVar42[3] = -(puVar27[3] == '\0');
    auVar42[4] = -(puVar27[4] == '\0');
    auVar42[5] = -(puVar27[5] == '\0');
    auVar42[6] = -(puVar27[6] == '\0');
    auVar42[7] = -(puVar27[7] == '\0');
    auVar42[8] = -(puVar27[8] == '\0');
    auVar42[9] = -(puVar27[9] == '\0');
    auVar42[10] = -(puVar27[10] == '\0');
    auVar42[0xb] = -(puVar27[0xb] == '\0');
    auVar42[0xc] = -(puVar27[0xc] == '\0');
    auVar42[0xd] = -(puVar27[0xd] == '\0');
    auVar42[0xe] = -(puVar27[0xe] == '\0');
    auVar42[0xf] = -(puVar27[0xf] == '\0');
    uVar28 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
    if (uVar28 == 0x7fff) {
      puVar27 = puVar27 + 0x10;
      ppVar36 = ppVar36 + 0xf;
    }
    else {
      uVar9 = 0;
      if ((uVar28 ^ 0x7fff) != 0) {
        for (; ((uVar28 ^ 0x7fff) >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
        }
      }
      if (puVar27[uVar9] == '\x01') {
        ppVar36 = (table_element_pointer)0x0;
      }
      else {
        puVar27 = puVar27 + uVar9;
        ppVar36 = (table_element_pointer)((long)&(ppVar36->first)._M_len + (ulong)(uVar9 << 5));
      }
    }
  } while (uVar28 == 0x7fff);
LAB_004adbf7:
  iVar65.p_ = ppVar36;
  iVar65.pc_ = puVar27;
  if (ppVar36 == (table_element_pointer)0x0) goto LAB_004adc57;
  goto LAB_004adb74;
}

Assistant:

Expression& AssertionInstanceExpression::fromLookup(const Symbol& symbol,
                                                    const InvocationExpressionSyntax* syntax,
                                                    SourceRange range,
                                                    const ASTContext& parentContext) {
    auto& comp = parentContext.getCompilation();
    const Type* type;
    const Scope* symbolScope;
    std::span<const AssertionPortSymbol* const> formalPorts;

    comp.noteReference(symbol);
    switch (symbol.kind) {
        case SymbolKind::Sequence: {
            auto& seq = symbol.as<SequenceSymbol>();
            type = &comp.getType(SyntaxKind::SequenceType);
            formalPorts = seq.ports;
            symbolScope = &seq;
            break;
        }
        case SymbolKind::Property: {
            auto& prop = symbol.as<PropertySymbol>();
            type = &comp.getType(SyntaxKind::PropertyType);
            formalPorts = prop.ports;
            symbolScope = &prop;
            break;
        }
        case SymbolKind::LetDecl: {
            auto& let = symbol.as<LetDeclSymbol>();
            type = &comp.getVoidType();
            formalPorts = let.ports;
            symbolScope = &let;
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }

    SmallVector<const SyntaxNode*> orderedArgs;
    NamedArgMap namedArgs;
    if (syntax && syntax->arguments) {
        if (!collectArgs(parentContext, *syntax->arguments, orderedArgs, namedArgs))
            return badExpr(comp, nullptr);
    }

    ASTContext context = parentContext;
    context.tryFillAssertionDetails();

    AssertionInstanceDetails instance;
    instance.symbol = &symbol;
    instance.prevContext = &context;
    instance.instanceLoc = range.start();

    // Check for recursive instantiation. This is illegal for sequences, and allowed in
    // some forms for properties.
    auto currInst = context.assertionInstance;
    while (currInst) {
        if (currInst->symbol == &symbol) {
            if (symbol.kind == SymbolKind::Sequence) {
                context.addDiag(diag::RecursiveSequence, range) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else if (symbol.kind == SymbolKind::LetDecl) {
                context.addDiag(diag::RecursiveLet, range) << symbol.name;
                return badExpr(comp, nullptr);
            }

            // Properties are allowed to be recursive, but we should avoid trying
            // to expand them because that will continue forever. Instead, we want
            // to expand one time for each unique invocation of the property and when
            // we encounter it again we should mark a placeholder and return to stop
            // the recursion.
            if (currInst->isRecursive) {
                auto& body = *comp.emplace<InvalidAssertionExpr>(nullptr);
                return *comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                                  /* isRecursiveProperty */ true,
                                                                  range);
            }
            instance.isRecursive = true;
        }

        if (currInst->argDetails)
            currInst = currInst->argDetails;
        else {
            SLANG_ASSERT(currInst->prevContext);
            currInst = currInst->prevContext->assertionInstance;
        }
    }

    // Now map all arguments to their formal ports.
    bool bad = false;
    uint32_t orderedIndex = 0;
    SourceLocation outputLocalVarArgLoc;
    SmallVector<std::tuple<const Symbol*, ActualArg>, 4> actualArgs;

    for (auto formal : formalPorts) {
        const ASTContext* argCtx = &context;
        const PropertyExprSyntax* expr = nullptr;
        std::optional<ASTContext> defValCtx;

        auto setDefault = [&] {
            expr = formal->defaultValueSyntax;
            defValCtx.emplace(*symbolScope, LookupLocation::after(*formal));
            defValCtx->assertionInstance = &instance;
            defValCtx->flags |= ASTFlags::AssertionDefaultArg;
            argCtx = &defValCtx.value();
        };

        if (orderedIndex < orderedArgs.size()) {
            auto arg = orderedArgs[orderedIndex++];
            if (arg->kind == SyntaxKind::EmptyArgument) {
                // Empty arguments are allowed as long as a default is provided.
                setDefault();
                if (!expr && !formal->name.empty())
                    context.addDiag(diag::ArgCannotBeEmpty, arg->sourceRange()) << formal->name;
            }
            else {
                expr = &arg->as<PropertyExprSyntax>();
            }

            // Make sure there isn't also a named value for this argument.
            if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
                auto& diag = context.addDiag(diag::DuplicateArgAssignment,
                                             it->second.first->name.location());
                diag << formal->name;
                diag.addNote(diag::NotePreviousUsage, arg->getFirstToken().location());
                it->second.second = true;
                bad = true;
            }
        }
        else if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
            // Mark this argument as used so that we can later detect if
            // any were unused.
            it->second.second = true;

            expr = it->second.first->expr;
            if (!expr) {
                // Empty arguments are allowed as long as a default is provided.
                setDefault();
                if (!expr && !formal->name.empty()) {
                    context.addDiag(diag::ArgCannotBeEmpty, it->second.first->sourceRange())
                        << formal->name;
                }
            }
        }
        else {
            setDefault();
            if (!expr) {
                if (namedArgs.empty()) {
                    auto& diag = context.addDiag(diag::TooFewArguments, range);
                    diag << symbol.name;
                    diag << formalPorts.size() << orderedArgs.size();
                    bad = true;
                    break;
                }
                else if (!formal->name.empty()) {
                    context.addDiag(diag::UnconnectedArg, range) << formal->name;
                }
            }
        }

        if (!expr) {
            bad = true;
            continue;
        }

        // Map the expression to the port symbol; this will be looked up later
        // when we encounter uses in the sequence / property body.
        instance.argumentMap.emplace(formal, std::make_tuple(expr, *argCtx));

        // Do type checking for all arguments now, even though the actuals will remain as
        // syntax nodes and be rebound when we actually encounter uses of them in the body.
        // This is because the arguments might not actually be used anywhere in the body,
        // so the only place to detect mismatches is here, but we can't save the bound
        // form because assertion item arguments are replaced as-is for each usage.
        ActualArg arg;
        if (!checkAssertionArg(*expr, *formal, *argCtx, arg, instance.isRecursive))
            bad = true;
        else
            actualArgs.push_back({formal, arg});

        if (!outputLocalVarArgLoc && (formal->direction == ArgumentDirection::InOut ||
                                      formal->direction == ArgumentDirection::Out)) {
            outputLocalVarArgLoc = formal->location;
        }
    }

    // Make sure there weren't too many ordered arguments provided.
    if (orderedIndex < orderedArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, range);
        diag << symbol.name;
        diag << formalPorts.size();
        diag << orderedArgs.size();
        bad = true;
    }

    for (auto& pair : namedArgs) {
        // We marked all the args that we used, so anything left over is an arg assignment
        // for a non-existent arg.
        if (!pair.second.second) {
            auto& diag = context.addDiag(diag::ArgDoesNotExist, pair.second.first->name.location());
            diag << pair.second.first->name.valueText();
            diag << symbol.name;
            bad = true;
        }
    }

    ASTContext bodyContext(*symbolScope, LookupLocation::max);
    bodyContext.assertionInstance = &instance;

    // Propagate previously determined time advance specs and negation operators
    if (context.flags.has(ASTFlags::PropertyTimeAdvance))
        bodyContext.flags |= ASTFlags::PropertyTimeAdvance;
    if (context.flags.has(ASTFlags::PropertyNegation))
        bodyContext.flags |= ASTFlags::PropertyNegation;

    // Let declarations expand directly to an expression.
    if (symbol.kind == SymbolKind::LetDecl)
        return create(comp, *symbol.as<LetDeclSymbol>().exprSyntax, bodyContext);

    // Now instantiate by creating the assertion expression of the sequence / property body.
    auto bodySyntax = symbol.getSyntax();
    SLANG_ASSERT(bodySyntax);

    SmallVector<const Symbol*> localVars;
    auto& body = bindAssertionBody(symbol, *bodySyntax, bodyContext, outputLocalVarArgLoc, instance,
                                   localVars);

    auto result = comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                            /* isRecursiveProperty */ false, range);
    result->arguments = actualArgs.copy(comp);
    result->localVars = localVars.copy(comp);

    if (instance.isRecursive) {
        if (!context.flags.has(ASTFlags::PropertyTimeAdvance))
            context.addDiag(diag::RecursivePropTimeAdvance, range);
        else if (context.flags.has(ASTFlags::PropertyNegation))
            context.addDiag(diag::RecursivePropNegation, range);
    }

    if (bad || body.bad())
        return badExpr(comp, result);

    return *result;
}